

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O2

void __thiscall fmp4_stream::tfhd::parse(tfhd *this,char *ptr)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  
  full_box::parse(&this->super_full_box,ptr);
  uVar2 = *(uint *)(ptr + 0xc);
  this->track_id_ = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  uVar2 = *(uint *)&(this->super_full_box).super_box.field_0x64;
  bVar3 = (byte)uVar2;
  (this->super_full_box).field_0x6c = bVar3 & 1;
  (this->super_full_box).field_0x6d = bVar3 >> 1 & 1;
  (this->super_full_box).field_0x6e = bVar3 >> 3 & 1;
  (this->super_full_box).field_0x6f = bVar3 >> 4 & 1;
  this->default_sample_flags_present_ = (bool)(bVar3 >> 5 & 1);
  this->duration_is_empty_ = (bool)((byte)(uVar2 >> 0x10) & 1);
  this->default_base_is_moof_ = (bool)((byte)(uVar2 >> 0x11) & 1);
  if ((uVar2 & 1) == 0) {
    uVar2 = 0x10;
  }
  else {
    uVar2 = *(uint *)(ptr + 0x10);
    this->base_data_offset_ =
         (ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18);
    uVar2 = 0x14;
  }
  if ((bVar3 >> 1 & 1) != 0) {
    uVar1 = *(uint *)(ptr + uVar2);
    this->sample_description_index_ =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar2 = uVar2 + 4;
  }
  if ((bVar3 >> 3 & 1) != 0) {
    uVar1 = *(uint *)(ptr + uVar2);
    this->default_sample_duration_ =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar2 = uVar2 + 4;
  }
  if ((bVar3 >> 4 & 1) != 0) {
    uVar1 = *(uint *)(ptr + uVar2);
    this->default_sample_size_ =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar2 = uVar2 + 4;
  }
  if ((bVar3 >> 5 & 1) != 0) {
    uVar2 = *(uint *)(ptr + uVar2);
    this->default_sample_flags_ =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  }
  return;
}

Assistant:

void tfhd::parse(const char * ptr)
	{
		full_box::parse(ptr);
		track_id_ = fmp4_read_uint32(ptr + 12);
		base_data_offset_present_ = !! (0x1u) & flags_;
		sample_description_index_present_ = !!(0x2u & flags_);
		default_sample_duration_present_ = !!(0x00000008u & flags_);
		default_sample_size_present_ = !!(0x00000010u & flags_);
		default_sample_flags_present_ = !!(0x00000020u & flags_);
		duration_is_empty_ = !!(0x00010000u & flags_);
		default_base_is_moof_ = !!(0x00020000u & flags_);

		unsigned int offset = 16;

		if (base_data_offset_present_)
		{
			base_data_offset_ = fmp4_read_uint32(ptr + offset);
			offset += 4;
		}
		if (sample_description_index_present_)
		{
			sample_description_index_ = fmp4_read_uint32(ptr + offset);
			offset += 4;
		}
		if (default_sample_duration_present_)
		{
			default_sample_duration_ = fmp4_read_uint32(ptr + offset);
			offset += 4;
		}
		if (default_sample_size_present_)
		{
			default_sample_size_ = fmp4_read_uint32(ptr + offset);
			offset += 4;
		}
		if (default_sample_flags_present_)
		{
			default_sample_flags_ = (uint32_t)fmp4_read_uint32(ptr + offset);
			offset += 4;
		}
	}